

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

int tcu::(anonymous_namespace)::convertSat<int,int>(int src)

{
  int iVar1;
  int max;
  int min;
  int src_local;
  
  min = std::numeric_limits<int>::min();
  iVar1 = std::numeric_limits<int>::max();
  if ((min <= src) && (min = src, iVar1 < src)) {
    min = iVar1;
  }
  return min;
}

Assistant:

static inline T convertSat (S src)
{
	S min = (S)std::numeric_limits<T>::min();
	S max = (S)std::numeric_limits<T>::max();

	if (src < min)
		return (T)min;
	else if (src > max)
		return (T)max;
	else
		return (T)src;
}